

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

void __thiscall kj::anon_unknown_77::AsyncTee::ensurePulling(AsyncTee *this)

{
  Disposer *pDVar1;
  PromiseNode *pPVar2;
  bool bVar3;
  Promise<void> PVar4;
  UnwindDetector unwind;
  UnwindDetector local_2c;
  undefined4 local_28;
  undefined4 uStack_24;
  uint uStack_20;
  undefined4 uStack_1c;
  
  if (this->pulling == false) {
    this->pulling = true;
    UnwindDetector::UnwindDetector(&local_2c);
    PVar4 = pull((AsyncTee *)&stack0xffffffffffffffd8);
    pDVar1 = (this->pullPromise).super_PromiseBase.node.disposer;
    pPVar2 = (this->pullPromise).super_PromiseBase.node.ptr;
    *(undefined4 *)&(this->pullPromise).super_PromiseBase.node.disposer = local_28;
    *(undefined4 *)((long)&(this->pullPromise).super_PromiseBase.node.disposer + 4) = uStack_24;
    *(uint *)&(this->pullPromise).super_PromiseBase.node.ptr = uStack_20;
    *(undefined4 *)((long)&(this->pullPromise).super_PromiseBase.node.ptr + 4) = uStack_1c;
    if (pPVar2 != (PromiseNode *)0x0) {
      (**pDVar1->_vptr_Disposer)
                (pDVar1,pPVar2->_vptr_PromiseNode[-2] + (long)&pPVar2->_vptr_PromiseNode,
                 PVar4.super_PromiseBase.node.ptr);
    }
    bVar3 = UnwindDetector::isUnwinding(&local_2c);
    if (bVar3) {
      this->pulling = false;
    }
  }
  return;
}

Assistant:

void ensurePulling() {
    if (!pulling) {
      pulling = true;
      UnwindDetector unwind;
      KJ_DEFER(if (unwind.isUnwinding()) pulling = false);
      pullPromise = pull();
    }
  }